

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O1

void Gia_ManStgPrint(FILE *pFile,Vec_Int_t *vLines,int nIns,int nOuts,int nStates)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar7;
  uint uVar8;
  long local_48;
  long lVar6;
  
  uVar8 = nStates;
  if (1 < (uint)nStates) {
    uVar8 = 0;
    uVar4 = nStates - 1;
    if (uVar4 != 0) {
      do {
        uVar8 = uVar8 + 1;
        bVar2 = 9 < uVar4;
        uVar4 = uVar4 / 10;
      } while (bVar2);
    }
  }
  if ((vLines->nSize & 3) != 0) {
    __assert_fail("Vec_IntSize(vLines) % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                  ,0x19a,"void Gia_ManStgPrint(FILE *, Vec_Int_t *, int, int, int)");
  }
  iVar5 = vLines->nSize;
  if (0 < iVar5) {
    local_48 = 0xc;
    lVar7 = 1;
    do {
      lVar6 = (long)iVar5;
      if (((lVar6 <= lVar7) || (lVar6 <= lVar7 + 1)) || (lVar6 <= lVar7 + 2)) {
LAB_007d5ca2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar1 = vLines->pArray;
      if ((piVar1[lVar7 + -1] < 0) || (1 << ((byte)nIns & 0x1f) <= piVar1[lVar7 + -1])) {
        __assert_fail("iMint >= 0 && iMint < (1<<nIns)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                      ,0x1a1,"void Gia_ManStgPrint(FILE *, Vec_Int_t *, int, int, int)");
      }
      if ((piVar1[lVar7] < 1) || (nStates < piVar1[lVar7])) {
        __assert_fail("iCur >= 0 && iCur < nStates",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                      ,0x1a2,"void Gia_ManStgPrint(FILE *, Vec_Int_t *, int, int, int)");
      }
      if ((piVar1[lVar7 + 1] < 1) || (nStates < piVar1[lVar7 + 1])) {
        __assert_fail("iNext >= 0 && iNext < nStates",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                      ,0x1a3,"void Gia_ManStgPrint(FILE *, Vec_Int_t *, int, int, int)");
      }
      if ((piVar1[lVar7 + 2] < 0) || (1 << ((byte)nOuts & 0x1f) <= piVar1[lVar7 + 2])) {
        __assert_fail("iOut >= 0 && iOut < (1<<nOuts)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                      ,0x1a4,"void Gia_ManStgPrint(FILE *, Vec_Int_t *, int, int, int)");
      }
      Extra_PrintBinary(pFile,(uint *)((long)piVar1 + local_48 + -0xc),nIns);
      if ((vLines->nSize <= lVar7) ||
         (fprintf((FILE *)pFile," %*d",(ulong)uVar8,(ulong)(uint)vLines->pArray[lVar7]),
         (long)vLines->nSize <= lVar7 + 1)) goto LAB_007d5ca2;
      fprintf((FILE *)pFile," %*d ",(ulong)uVar8,(ulong)(uint)vLines->pArray[lVar7 + 1]);
      if ((long)vLines->nSize <= lVar7 + 2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      Extra_PrintBinary(pFile,(uint *)((long)vLines->pArray + local_48),nOuts);
      fputc(10,(FILE *)pFile);
      iVar5 = vLines->nSize;
      local_48 = local_48 + 0x10;
      iVar3 = (int)lVar7;
      lVar7 = lVar7 + 4;
    } while (iVar3 + 3 < iVar5);
  }
  return;
}

Assistant:

void Gia_ManStgPrint( FILE * pFile, Vec_Int_t * vLines, int nIns, int nOuts, int nStates )
{
    int i, nDigits = Abc_Base10Log( nStates );
    assert( Vec_IntSize(vLines) % 4 == 0 );
    for ( i = 0; i < Vec_IntSize(vLines); i += 4 )
    {
        int iMint = Vec_IntEntry(vLines, i  );
        int iCur  = Vec_IntEntry(vLines, i+1) - 1;
        int iNext = Vec_IntEntry(vLines, i+2) - 1;
        int iOut  = Vec_IntEntry(vLines, i+3);
        assert( iMint >= 0 && iMint < (1<<nIns)  );
        assert( iCur  >= 0 && iCur  < nStates    );
        assert( iNext >= 0 && iNext < nStates    );
        assert( iOut  >= 0 && iOut  < (1<<nOuts) );
        Extra_PrintBinary( pFile, (unsigned *)Vec_IntEntryP(vLines, i),  nIns );
        fprintf( pFile, " %*d",  nDigits,     Vec_IntEntry(vLines,  i+1) );
        fprintf( pFile, " %*d ", nDigits,     Vec_IntEntry(vLines,  i+2) );
        Extra_PrintBinary( pFile, (unsigned *)Vec_IntEntryP(vLines, i+3), nOuts );
        fprintf( pFile, "\n" );
    }
}